

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

string * __thiscall
pbrt::CameraBase::ToString_abi_cxx11_(string *__return_storage_ptr__,CameraBase *this)

{
  long lVar1;
  Vector3<float> *in_stack_ffffffffffffff90;
  FilmHandle local_58;
  string local_50;
  
  lVar1 = (this->medium).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits << 0x10;
  if (lVar1 == 0) {
    local_50._M_dataplus._M_p = "(nullptr)";
  }
  else {
    in_stack_ffffffffffffff90 = (Vector3<float> *)0x3756d8;
    MediumHandle::ToString_abi_cxx11_(&local_50,&this->medium);
  }
  local_58.super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits =
       (TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>)
       (TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>)local_50._M_dataplus._M_p;
  StringPrintf<pbrt::CameraTransform_const&,float_const&,float_const&,pbrt::FilmHandle_const&,char_const*,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&>
            (__return_storage_ptr__,
             (pbrt *)
             "cameraTransform: %s shutterOpen: %f shutterClose: %f film: %s medium: %s minPosDifferentialX: %s minPosDifferentialY: %s minDirDifferentialX: %s minDirDifferentialY: %s "
             ,(char *)this,(CameraTransform *)&this->shutterOpen,&this->shutterClose,
             (float *)&this->film,&local_58,(char **)&this->minPosDifferentialX,
             &this->minPosDifferentialY,&this->minDirDifferentialX,&this->minDirDifferentialY,
             in_stack_ffffffffffffff90);
  if (lVar1 != 0) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CameraBase::ToString() const {
    return StringPrintf("cameraTransform: %s shutterOpen: %f shutterClose: %f film: %s "
                        "medium: %s minPosDifferentialX: %s minPosDifferentialY: %s "
                        "minDirDifferentialX: %s minDirDifferentialY: %s ",
                        cameraTransform, shutterOpen, shutterClose, film,
                        medium ? medium.ToString().c_str() : "(nullptr)",
                        minPosDifferentialX, minPosDifferentialY, minDirDifferentialX,
                        minDirDifferentialY);
}